

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileData.h
# Opt level: O1

void __thiscall Assimp::Q3BSP::Q3BSPModel::~Q3BSPModel(Q3BSPModel *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer puVar4;
  bool bVar5;
  pointer ppsVar6;
  pointer ppsVar7;
  pointer ppsVar8;
  pointer ppsVar9;
  pointer ppsVar10;
  ulong uVar11;
  ulong uVar12;
  
  ppsVar6 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Lumps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar6) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      if (ppsVar6[uVar11] != (sQ3BSPLump *)0x0) {
        operator_delete(ppsVar6[uVar11]);
      }
      ppsVar6 = (this->m_Lumps).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar12 < (ulong)((long)(this->m_Lumps).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar6 >> 3
                              );
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  ppsVar7 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar7) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      if (ppsVar7[uVar11] != (sQ3BSPVertex *)0x0) {
        operator_delete(ppsVar7[uVar11]);
      }
      ppsVar7 = (this->m_Vertices).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar12 < (ulong)((long)(this->m_Vertices).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar7 >> 3
                              );
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  ppsVar8 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Faces).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar8) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      if (ppsVar8[uVar11] != (sQ3BSPFace *)0x0) {
        operator_delete(ppsVar8[uVar11]);
      }
      ppsVar8 = (this->m_Faces).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar12 < (ulong)((long)(this->m_Faces).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar8 >> 3
                              );
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  ppsVar9 = (this->m_Textures).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Textures).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar9) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      if (ppsVar9[uVar11] != (sQ3BSPTexture *)0x0) {
        operator_delete(ppsVar9[uVar11]);
      }
      ppsVar9 = (this->m_Textures).
                super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar12 < (ulong)((long)(this->m_Textures).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar9 >> 3
                              );
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  ppsVar10 = (this->m_Lightmaps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Lightmaps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar10) {
    uVar11 = 0;
    uVar12 = 1;
    do {
      if (ppsVar10[uVar11] != (sQ3BSPLightmap *)0x0) {
        operator_delete(ppsVar10[uVar11]);
      }
      ppsVar10 = (this->m_Lightmaps).
                 super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar12 < (ulong)((long)(this->m_Lightmaps).
                                     super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar10 >>
                              3);
      uVar11 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar5);
  }
  ppsVar6 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Lumps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar6) {
    (this->m_Lumps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar6;
  }
  ppsVar7 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Vertices).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar7) {
    (this->m_Vertices).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar7;
  }
  ppsVar8 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Faces).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppsVar8) {
    (this->m_Faces).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppsVar8;
  }
  ppsVar9 = (this->m_Textures).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Textures).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar9) {
    (this->m_Textures).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar9;
  }
  if ((this->m_Lightmaps).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppsVar10) {
    (this->m_Lightmaps).
    super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppsVar10;
  }
  pcVar1 = (this->m_ModelName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_ModelName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar2 = (this->m_EntityData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2);
  }
  ppsVar10 = (this->m_Lightmaps).
             super__Vector_base<Assimp::Q3BSP::sQ3BSPLightmap_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLightmap_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar10 != (pointer)0x0) {
    operator_delete(ppsVar10);
  }
  ppsVar9 = (this->m_Textures).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar9 != (pointer)0x0) {
    operator_delete(ppsVar9);
  }
  piVar3 = (this->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  ppsVar8 = (this->m_Faces).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar8 != (pointer)0x0) {
    operator_delete(ppsVar8);
  }
  ppsVar7 = (this->m_Vertices).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar7 != (pointer)0x0) {
    operator_delete(ppsVar7);
  }
  ppsVar6 = (this->m_Lumps).
            super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppsVar6 != (pointer)0x0) {
    operator_delete(ppsVar6);
  }
  puVar4 = (this->m_Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
    return;
  }
  return;
}

Assistant:

~Q3BSPModel() {
        for ( unsigned int i=0; i<m_Lumps.size(); i++ ) {
            delete m_Lumps[ i ];
        }
        for ( unsigned int i=0; i<m_Vertices.size(); i++ ) {
            delete m_Vertices[ i ];
        }
        for ( unsigned int i=0; i<m_Faces.size(); i++ ) {
            delete m_Faces[ i ];
        }
        for ( unsigned int i=0; i<m_Textures.size(); i++ ) {
            delete m_Textures[ i ];
        }
        for ( unsigned int i=0; i<m_Lightmaps.size(); i++ ) {
            delete m_Lightmaps[ i ];
        }

        m_Lumps.clear();
        m_Vertices.clear();
        m_Faces.clear();
        m_Textures.clear();
        m_Lightmaps.clear();
    }